

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

double duckdb::Cast::Operation<unsigned_short,double>(unsigned_short input)

{
  bool bVar1;
  unkbyte10 Var2;
  double result;
  double local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_short,double>(input,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  Var2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_short,double>
            (&local_38,(duckdb *)(ulong)input,(unsigned_short)((unkuint10)Var2 >> 0x40));
  InvalidInputException::InvalidInputException((InvalidInputException *)Var2,&local_38);
  __cxa_throw((InvalidInputException *)Var2,&InvalidInputException::typeinfo,
              ::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}